

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O3

int __thiscall
ON_UserStringList::SetUserStrings(ON_UserStringList *this,int count,ON_UserString *us,bool bReplace)

{
  ON_ClassArray<ON_UserString> *this_00;
  ON_UserString *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON__UINT32 OVar5;
  ON_2dex *base;
  ON_2dex *pOVar6;
  size_t nel;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ON_UserString *pOVar18;
  int local_7c;
  ulong local_78;
  int local_5c;
  
  local_7c = 0;
  if (us != (ON_UserString *)0x0 && 0 < count) {
    if (count == 1) {
      bVar2 = ON_wString::IsEmpty(&us->m_key);
      local_7c = 0;
      if ((!bVar2) && (0 < (this->m_e).m_count)) {
        lVar9 = 0;
        lVar17 = 0;
        do {
          iVar3 = ON_wString::CompareOrdinal
                            ((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar9),
                             &us->m_key,true);
          if (iVar3 == 0) {
            if (bReplace) {
              bVar2 = ON_wString::IsEmpty(&us->m_string_value);
              if (bVar2) {
                ON_ClassArray<ON_UserString>::Remove(&this->m_e,(int)lVar17);
              }
              else {
                pOVar18 = (this->m_e).m_a;
                ON_wString::operator=
                          ((ON_wString *)((long)&(pOVar18->m_key).m_s + lVar9),&us->m_key);
                ON_wString::operator=
                          ((ON_wString *)((long)&(pOVar18->m_string_value).m_s + lVar9),
                           &us->m_string_value);
              }
              return 1;
            }
            break;
          }
          lVar17 = lVar17 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar17 < (this->m_e).m_count);
        local_7c = 0;
      }
    }
    else {
      iVar3 = (this->m_e).m_count;
      local_78 = (ulong)iVar3;
      uVar4 = iVar3 + count;
      nel = (size_t)(int)uVar4;
      uVar12 = (ulong)(uint)count;
      base = (ON_2dex *)onmalloc((nel + uVar12) * 8);
      if (0 < (long)local_78) {
        piVar10 = &base->j;
        lVar9 = 0;
        iVar13 = 0;
        do {
          OVar5 = ON_wString::DataCRCLower
                            ((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar9),0);
          ((ON_2dex *)(piVar10 + -1))->i = OVar5;
          *piVar10 = iVar13;
          iVar13 = iVar13 + 1;
          piVar10 = piVar10 + 2;
          lVar9 = lVar9 + 0x10;
        } while (local_78 << 4 != lVar9);
      }
      this_00 = &this->m_e;
      piVar10 = &base[local_78].j;
      uVar16 = 0;
      pOVar18 = us;
      do {
        OVar5 = ON_wString::DataCRCLower(&pOVar18->m_key,0);
        base[nel + uVar16].i = OVar5;
        base[nel + uVar16].j = (int)uVar16;
        ((ON_2dex *)(piVar10 + -1))->i = OVar5;
        *piVar10 = iVar3;
        uVar16 = uVar16 + 1;
        iVar3 = iVar3 + 1;
        piVar10 = piVar10 + 2;
        pOVar18 = pOVar18 + 1;
      } while (uVar12 != uVar16);
      ON_qsort(base,nel,8,cmp_hash_2dex_ij);
      if ((uint)(this->m_e).m_capacity < uVar4) {
        ON_ClassArray<ON_UserString>::SetCapacity(this_00,nel);
      }
      uVar16 = 0;
      local_5c = 0;
      local_7c = 0;
      do {
        pOVar18 = us + uVar16;
        bVar2 = ON_wString::IsEmpty(&pOVar18->m_key);
        if (!bVar2) {
          pOVar6 = ON_BinarySearch2dexArray(base[nel + uVar16].i,base,nel);
          if (pOVar6 == (ON_2dex *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_userdata.cpp"
                       ,0x3cd,"","There is a bug in this function.");
          }
          else {
            uVar14 = (long)pOVar6 - (long)base >> 3;
            if (pOVar6 != base) {
              piVar10 = &pOVar6->i;
              do {
                pOVar6 = pOVar6 + -1;
                if (pOVar6->i != *piVar10) goto LAB_006616a9;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
              uVar14 = 0;
            }
LAB_006616a9:
            iVar3 = (int)local_78;
            uVar15 = uVar14 + 1;
            uVar8 = uVar14;
            uVar7 = uVar15;
            if (uVar15 < nel) {
              uVar7 = nel;
            }
            do {
              uVar11 = uVar7;
              if ((nel <= uVar15) || (uVar11 = uVar8 + 1, base[uVar15].i != base[uVar14].i)) break;
              pOVar6 = base + uVar15;
              uVar8 = uVar8 + 1;
              uVar11 = uVar15;
              uVar15 = uVar15 + 1;
            } while (pOVar6->j <= iVar3 + (int)uVar16);
            uVar15 = uVar14;
            if ((base[uVar14].j < iVar3) && (uVar14 < uVar11)) {
              do {
                if ((base[uVar14].j < iVar3) &&
                   (iVar13 = ON_wString::CompareOrdinal
                                       (&(this->m_e).m_a[base[uVar14].j].m_key,&pOVar18->m_key,true)
                   , iVar13 == 0)) {
                  if (bReplace) {
                    iVar3 = base[uVar14].j;
                    pOVar1 = (this->m_e).m_a;
                    ON_wString::operator=(&pOVar1[iVar3].m_key,&pOVar18->m_key);
                    ON_wString::operator=(&pOVar1[iVar3].m_string_value,&pOVar18->m_string_value);
                    local_7c = local_7c + 1;
                    bVar2 = ON_wString::IsEmpty(&pOVar18->m_string_value);
                    local_5c = local_5c + (uint)bVar2;
                  }
                  goto LAB_00661795;
                }
                uVar14 = uVar14 + 1;
                uVar15 = uVar11;
              } while (uVar11 != uVar14);
            }
            bVar2 = ON_wString::IsEmpty(&pOVar18->m_string_value);
            if (!bVar2) {
              base[uVar15].j = iVar3;
              local_78 = (ulong)(iVar3 + 1);
              ON_ClassArray<ON_UserString>::Append(this_00,pOVar18);
              local_7c = local_7c + 1;
            }
          }
        }
LAB_00661795:
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
      onfree(base);
      uVar12 = (ulong)(this->m_e).m_count;
      if ((0 < (long)uVar12) && (0 < local_5c)) {
        lVar9 = uVar12 * 0x10 + -8;
        do {
          bVar2 = ON_wString::IsEmpty((ON_wString *)((long)&(((this->m_e).m_a)->m_key).m_s + lVar9))
          ;
          if (bVar2) {
            ON_ClassArray<ON_UserString>::Remove(this_00,(int)uVar12 + -1);
            local_5c = local_5c + -1;
          }
          if (uVar12 < 2) {
            return local_7c;
          }
          lVar9 = lVar9 + -0x10;
          uVar12 = uVar12 - 1;
        } while (0 < local_5c);
      }
    }
  }
  return local_7c;
}

Assistant:

int ON_UserStringList::SetUserStrings( int count, const ON_UserString* us, bool bReplace )
{
  int added_count = 0;
  int i;

  if ( count <= 0 || 0 == us )
    return 0;

  if ( 1 == count )
  {
    // skip the hash table hoo haa
    if (  us[0].m_key.IsEmpty() )
      return 0;
    for ( i = 0; i < m_e.Count(); i++ )
    {
      if ( m_e[i].m_key.CompareOrdinal(us[0].m_key, true ) )
        continue;
      if ( bReplace )
      {
        if ( us[0].m_string_value.IsEmpty() )
          m_e.Remove(i);
        else
          m_e[i] = us[0];
        added_count++;
      }
      break;
    }
    return added_count;
  }

  size_t k0, k1;
  int count0 = m_e.Count();
  size_t count0_plus_count = (size_t)(count0 + count);
  ON_2dex* hash = (ON_2dex*)onmalloc( (count0_plus_count + count)*sizeof(hash[0]) );
  ON_2dex* hash1 =  hash + (count0_plus_count);
  const ON_2dex* h;
  int deleted_count = 0;

  for ( i = 0; i < count0; i++ )
  {
    hash[i].i = (int)m_e[i].m_key.DataCRCLower(0);
    hash[i].j = i;
  }

  for ( i = 0; i < count; i++ )
  {
    hash1[i].i = (int)us[i].m_key.DataCRCLower(0);
    hash1[i].j = i;
    hash[i+count0].i = hash1[i].i;
    hash[i+count0].j = hash1[i].j+count0;
  }
  ON_qsort(hash,count0_plus_count,sizeof(hash[0]),cmp_hash_2dex_ij);

  m_e.Reserve(count0+count);
  for ( i = 0; i < count; i++)
  {
    if ( us[i].m_key.IsEmpty() )
      continue;

    // Set k0, k1 so that hash[k0]....,hash[k1-1] are 
    // the hash[] entries keys with the same hash code
    // as us[i].m_key.
    h = ON_BinarySearch2dexArray(hash1[i].i,hash,count0_plus_count);
    if ( 0 == h )
    {
      ON_ERROR("There is a bug in this function.");
      continue;
    }
    k0 = h-hash;
    while ( k0 > 0 && h[-1].i == h[0].i )
    {
      // set h = first element in hash[] with this hash code.
      k0--;
      h--;
    }
    for (k1 = k0+1; k1 < count0_plus_count; k1++ )
    {
      if ( hash[k1].i != hash[k0].i )
        break;
      if ( hash[k1].j > i+count0 )
        break;
    }

    if ( hash[k0].j >= count0 )
    {
      // There are no entries in m_e[] with key matching hash,
      // so us[i].m_key is not present in m_e.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
      continue;
    }

    for (/* empty init*/; k0 < k1; k0++ )
    {
      if ( hash[k0].j < count0 )
      {
        if ( m_e[hash[k0].j].m_key.CompareOrdinal(us[i].m_key,true) )
          continue; // different keys with same hash
        if ( bReplace )
        {
          m_e[hash[k0].j] = us[i];
          added_count++;
          if ( us[i].m_string_value.IsEmpty() )
            deleted_count++;
        }
        break;
      }
    }

    if ( k0 >= k1 )
    {
      // hash is unique up to this point, so us[i].m_key is unique, 
      // so we add it if it is valid.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
    }
  }

  onfree(hash);

  // remove deleted items.
  i = m_e.Count();
  while ( i-- > 0 && deleted_count > 0 )
  {
    if ( m_e[i].m_string_value.IsEmpty() )
    {
      m_e.Remove(i);
      deleted_count--;
    }
  }

  return added_count;
}